

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O1

_Bool Curl_pipeline_penalized(Curl_easy *data,connectdata *conn)

{
  curl_llist_element *pcVar1;
  curl_off_t cVar2;
  curl_off_t cVar3;
  char *pcVar4;
  _Bool _Var5;
  _Bool _Var6;
  long lVar7;
  
  if (data == (Curl_easy *)0x0) {
    _Var6 = false;
  }
  else {
    cVar2 = Curl_multi_content_length_penalty_size(data->multi);
    cVar3 = Curl_multi_chunk_length_penalty_size(data->multi);
    pcVar1 = (conn->recv_pipe).head;
    if (pcVar1 == (curl_llist_element *)0x0) {
      lVar7 = -2;
      _Var5 = false;
    }
    else {
      lVar7 = *(long *)((long)pcVar1->ptr + 0xc0);
      _Var5 = cVar2 < lVar7 && 0 < cVar2;
    }
    _Var6 = _Var5;
    if ((0 < cVar3) && (_Var6 = true, (conn->chunk).datasize <= cVar3)) {
      _Var6 = _Var5;
    }
    pcVar4 = "FALSE";
    if (_Var6 != false) {
      pcVar4 = "TRUE";
    }
    Curl_infof(data,"Conn: %ld (%p) Receive pipe weight: (%ld/%zu), penalized: %s\n",
               conn->connection_id,conn,lVar7,(conn->chunk).datasize,pcVar4);
  }
  return _Var6;
}

Assistant:

bool Curl_pipeline_penalized(struct Curl_easy *data,
                             struct connectdata *conn)
{
  if(data) {
    bool penalized = FALSE;
    curl_off_t penalty_size =
      Curl_multi_content_length_penalty_size(data->multi);
    curl_off_t chunk_penalty_size =
      Curl_multi_chunk_length_penalty_size(data->multi);
    curl_off_t recv_size = -2; /* Make it easy to spot in the log */

    /* Find the head of the recv pipe, if any */
    if(conn->recv_pipe.head) {
      struct Curl_easy *recv_handle = conn->recv_pipe.head->ptr;

      recv_size = recv_handle->req.size;

      if(penalty_size > 0 && recv_size > penalty_size)
        penalized = TRUE;
    }

    if(chunk_penalty_size > 0 &&
       (curl_off_t)conn->chunk.datasize > chunk_penalty_size)
      penalized = TRUE;

    infof(data, "Conn: %ld (%p) Receive pipe weight: (%"
          CURL_FORMAT_CURL_OFF_T "/%zu), penalized: %s\n",
          conn->connection_id, (void *)conn, recv_size,
          conn->chunk.datasize, penalized?"TRUE":"FALSE");
    return penalized;
  }
  return FALSE;
}